

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::_process_exception(Executor *this,Worker *param_1,Node *node)

{
  uint uVar1;
  Topology *pTVar2;
  uint uVar3;
  uint uVar4;
  Node *pNVar5;
  exception_ptr *this_00;
  bool bVar6;
  exception_ptr eStack_18;
  
  for (pNVar5 = node; pNVar5 != (Node *)0x0; pNVar5 = pNVar5->_parent) {
    uVar4 = (pNVar5->_estate).super___atomic_base<int>._M_i;
    uVar3 = (pNVar5->_estate).super___atomic_base<int>._M_i;
    do {
      LOCK();
      uVar1 = (pNVar5->_estate).super___atomic_base<int>._M_i;
      bVar6 = uVar3 == uVar1;
      if (bVar6) {
        (pNVar5->_estate).super___atomic_base<int>._M_i = uVar3 | 0x30000000;
        uVar1 = uVar3;
      }
      uVar3 = uVar1;
      UNLOCK();
    } while (!bVar6);
    if ((uVar4 >> 0x1e & 1) != 0) {
      if ((uVar3 >> 0x1c & 1) != 0) goto LAB_0010828f;
      std::current_exception();
      this_00 = &pNVar5->_exception_ptr;
      goto LAB_0010827f;
    }
  }
  pTVar2 = node->_topology;
  if (pTVar2 != (Topology *)0x0) {
    uVar4 = (pTVar2->_estate).super___atomic_base<int>._M_i;
    do {
      LOCK();
      uVar3 = (pTVar2->_estate).super___atomic_base<int>._M_i;
      bVar6 = uVar4 == uVar3;
      if (bVar6) {
        (pTVar2->_estate).super___atomic_base<int>._M_i = uVar4 | 0x30000000;
        uVar3 = uVar4;
      }
      uVar4 = uVar3;
      UNLOCK();
    } while (!bVar6);
    if ((uVar4 >> 0x1c & 1) == 0) {
      std::current_exception();
      this_00 = &pTVar2->_exception_ptr;
LAB_0010827f:
      std::__exception_ptr::exception_ptr::operator=(this_00,&eStack_18);
      goto LAB_001082af;
    }
  }
LAB_0010828f:
  std::current_exception();
  std::__exception_ptr::exception_ptr::operator=(&node->_exception_ptr,&eStack_18);
LAB_001082af:
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  return;
}

Assistant:

inline void Executor::_process_exception(Worker&, Node* node) {

  constexpr static auto flag = ESTATE::EXCEPTION | ESTATE::CANCELLED;

  // find the anchor and mark the entire path with exception so recursive
  // or nested tasks can be cancelled properly
  // since exception can come from asynchronous task (with runtime), the node
  // itself can be anchored
  auto anchor = node;
  while(anchor && (anchor->_estate.load(std::memory_order_relaxed) & ESTATE::ANCHORED) == 0) {
    anchor->_estate.fetch_or(flag, std::memory_order_relaxed);
    anchor = anchor->_parent;
  }

  // the exception occurs under a blocking call (e.g., corun, join)
  if(anchor) {
    // multiple tasks may throw, and we only take the first thrown exception
    if((anchor->_estate.fetch_or(flag, std::memory_order_relaxed) & ESTATE::EXCEPTION) == 0) {
      anchor->_exception_ptr = std::current_exception();
      return;
    }
  }
  // otherwise, we simply store the exception in the topology and cancel it
  else if(auto tpg = node->_topology; tpg) {
    // multiple tasks may throw, and we only take the first thrown exception
    if((tpg->_estate.fetch_or(flag, std::memory_order_relaxed) & ESTATE::EXCEPTION) == 0) {
      tpg->_exception_ptr = std::current_exception();
      return;
    }
  }
  
  // for now, we simply store the exception in this node; this can happen in an 
  // execution that does not have any external control to capture the exception,
  // such as silent async task
  node->_exception_ptr = std::current_exception();
}